

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

string * covenant::witness_impl::to_string_abi_cxx11_(witness_t *witness,TermFactory *tfac)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  string *in_RDI;
  uint ii;
  stringstream ss;
  shared_ptr<covenant::TerminalFactory> *in_stack_fffffffffffffde0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf0;
  string local_1e0 [32];
  undefined4 in_stack_fffffffffffffe40;
  uint uVar4;
  TerminalFactory *in_stack_fffffffffffffe48;
  ostream local_1a8 [399];
  allocator local_19 [9];
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffdf0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"\"\"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe48);
    uVar4 = 0;
    while( true ) {
      uVar2 = (ulong)uVar4;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(local_10);
      if (sVar3 <= uVar2) break;
      boost::shared_ptr<covenant::TerminalFactory>::operator->(in_stack_fffffffffffffde0);
      std::vector<int,_std::allocator<int>_>::operator[](local_10,(ulong)uVar4);
      TerminalFactory::remap_abi_cxx11_
                (in_stack_fffffffffffffe48,CONCAT44(uVar4,in_stack_fffffffffffffe40));
      in_stack_fffffffffffffde0 =
           (shared_ptr<covenant::TerminalFactory> *)std::operator<<(local_1a8,local_1e0);
      std::operator<<((ostream *)in_stack_fffffffffffffde0," ");
      std::__cxx11::string::~string(local_1e0);
      uVar4 = uVar4 + 1;
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe48);
  }
  return in_RDI;
}

Assistant:

inline string to_string(const witness_t& witness, TermFactory tfac)
    {
      if (witness.empty ()) // epsilon
        return "\"\"";

      stringstream ss;      
      for(unsigned int ii = 0; ii < witness.size(); ii++)
      {
        // ss << (char) witness[ii];
        ss << tfac->remap (witness[ii]) << " ";
      }
      return ss.str();
    }